

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genRunFunction_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,bool parallelize)

{
  undefined8 *puVar1;
  bool bVar2;
  pointer puVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_t sVar7;
  TDNode *pTVar8;
  _Bit_iterator *p_Var9;
  pointer pvVar10;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pvVar14;
  size_type *psVar15;
  undefined7 in_register_00000011;
  size_t rel;
  ulong uVar16;
  pointer puVar17;
  char cVar18;
  CppGenerator *pCVar19;
  pointer puVar20;
  ulong *puVar21;
  string *psVar22;
  ulong uVar23;
  long lVar24;
  string __str_3;
  string __str;
  string __str_1;
  string returnString;
  ulong *local_378;
  long local_370;
  ulong local_368;
  long lStack_360;
  CppGenerator *local_358;
  ulong *local_350;
  long local_348;
  ulong local_340;
  long lStack_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  undefined8 uStack_318;
  vector<bool,_std::allocator<bool>_> local_310;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298;
  long lStack_290;
  undefined8 *local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  long lStack_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ulong *local_188;
  long local_180;
  ulong local_178;
  undefined8 uStack_170;
  ulong *local_168;
  long local_160;
  ulong local_158;
  long lStack_150;
  pointer local_148;
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110 [2];
  string *local_100;
  ulong local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_148 = (pointer)CONCAT44(local_148._4_4_,(int)CONCAT71(in_register_00000011,parallelize));
  local_358 = this;
  local_350 = &local_340;
  std::__cxx11::string::_M_construct((ulong)&local_350,'\x03');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_350);
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_368 = *puVar21;
    lStack_360 = plVar5[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar21;
    local_378 = (ulong *)*plVar5;
  }
  local_370 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_330 = &local_320;
  std::__cxx11::string::_M_construct((ulong)&local_330,'\x03');
  uVar16 = 0xf;
  if (local_378 != &local_368) {
    uVar16 = local_368;
  }
  if (uVar16 < (ulong)(local_328 + local_370)) {
    uVar16 = 0xf;
    if (local_330 != &local_320) {
      uVar16 = local_320;
    }
    if (uVar16 < (ulong)(local_328 + local_370)) goto LAB_00221f0e;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,(ulong)local_378);
  }
  else {
LAB_00221f0e:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_330);
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish;
  puVar1 = puVar6 + 2;
  if ((_Bit_iterator *)*puVar6 == (_Bit_iterator *)puVar1) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*puVar1;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = puVar6[3];
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*puVar1;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*puVar6;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_1a8 = &local_198;
  plVar11 = plVar5 + 2;
  if ((long *)*plVar5 == plVar11) {
    local_198 = *plVar11;
    lStack_190 = plVar5[3];
  }
  else {
    local_198 = *plVar11;
    local_1a8 = (long *)*plVar5;
  }
  local_1a0 = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p !=
      &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  local_120 = local_110;
  std::__cxx11::string::_M_construct((ulong)&local_120,'\x06');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_140 = &local_130;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_130 = *puVar21;
    lStack_128 = plVar5[3];
  }
  else {
    local_130 = *puVar21;
    local_140 = (ulong *)*plVar5;
  }
  local_138 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_158 = *puVar21;
    lStack_150 = plVar5[3];
    local_168 = &local_158;
  }
  else {
    local_158 = *puVar21;
    local_168 = (ulong *)*plVar5;
  }
  local_160 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\x06');
  uVar16 = 0xf;
  if (local_168 != &local_158) {
    uVar16 = local_158;
  }
  if (uVar16 < (ulong)(local_48 + local_160)) {
    uVar16 = 0xf;
    if (local_50 != local_40) {
      uVar16 = local_40[0];
    }
    if (uVar16 < (ulong)(local_48 + local_160)) goto LAB_0022216c;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_168);
  }
  else {
LAB_0022216c:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_50);
  }
  local_188 = &local_178;
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_178 = *puVar21;
    uStack_170 = puVar6[3];
  }
  else {
    local_178 = *puVar21;
    local_188 = (ulong *)*puVar6;
  }
  local_180 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)puVar21 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_1e8 = &local_1d8;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_1d8 = *puVar21;
    lStack_1d0 = plVar5[3];
  }
  else {
    local_1d8 = *puVar21;
    local_1e8 = (ulong *)*plVar5;
  }
  local_1e0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x06');
  uVar16 = 0xf;
  if (local_1e8 != &local_1d8) {
    uVar16 = local_1d8;
  }
  if (uVar16 < (ulong)(local_68 + local_1e0)) {
    uVar16 = 0xf;
    if (local_70 != local_60) {
      uVar16 = local_60[0];
    }
    if (uVar16 < (ulong)(local_68 + local_1e0)) goto LAB_002222c2;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_1e8);
  }
  else {
LAB_002222c2:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_70);
  }
  local_208 = &local_1f8;
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_1f8 = *puVar21;
    lStack_1f0 = puVar6[3];
  }
  else {
    local_1f8 = *puVar21;
    local_208 = (ulong *)*puVar6;
  }
  local_200 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)puVar21 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
  local_1c8 = &local_1b8;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_1b8 = *puVar21;
    lStack_1b0 = plVar5[3];
  }
  else {
    local_1b8 = *puVar21;
    local_1c8 = (ulong *)*plVar5;
  }
  local_1c0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_228 = &local_218;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_218 = *puVar21;
    lStack_210 = plVar5[3];
  }
  else {
    local_218 = *puVar21;
    local_228 = (ulong *)*plVar5;
  }
  local_220 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x06');
  uVar16 = 0xf;
  if (local_228 != &local_218) {
    uVar16 = local_218;
  }
  if (uVar16 < (ulong)(local_88 + local_220)) {
    uVar16 = 0xf;
    if (local_90 != local_80) {
      uVar16 = local_80[0];
    }
    if (uVar16 < (ulong)(local_88 + local_220)) goto LAB_00222478;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_228);
  }
  else {
LAB_00222478:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_90);
  }
  local_248 = &local_238;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_238 = *plVar5;
    lStack_230 = puVar6[3];
  }
  else {
    local_238 = *plVar5;
    local_248 = (long *)*puVar6;
  }
  local_240 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_268 = &local_258;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_258 = *puVar21;
    lStack_250 = plVar5[3];
  }
  else {
    local_258 = *puVar21;
    local_268 = (ulong *)*plVar5;
  }
  local_260 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_298 = *puVar21;
    lStack_290 = plVar5[3];
    local_2a8 = &local_298;
  }
  else {
    local_298 = *puVar21;
    local_2a8 = (ulong *)*plVar5;
  }
  local_2a0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\x06');
  uVar16 = 0xf;
  if (local_2a8 != &local_298) {
    uVar16 = local_298;
  }
  if (uVar16 < (ulong)(local_a8 + local_2a0)) {
    uVar16 = 0xf;
    if (local_b0 != local_a0) {
      uVar16 = local_a0[0];
    }
    if (uVar16 < (ulong)(local_a8 + local_2a0)) goto LAB_00222626;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_2a8);
  }
  else {
LAB_00222626:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_b0);
  }
  local_288 = &local_278;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_278 = *puVar1;
    uStack_270 = puVar6[3];
  }
  else {
    local_278 = *puVar1;
    local_288 = (undefined8 *)*puVar6;
  }
  local_280 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_2c8 = &local_2b8;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_2b8 = *puVar21;
    lStack_2b0 = plVar5[3];
  }
  else {
    local_2b8 = *puVar21;
    local_2c8 = (ulong *)*plVar5;
  }
  local_2c0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_2e8 = &local_2d8;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_2d8 = *puVar21;
    lStack_2d0 = plVar5[3];
  }
  else {
    local_2d8 = *puVar21;
    local_2e8 = (ulong *)*plVar5;
  }
  local_2e0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_100 = __return_storage_ptr__;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\x06');
  uVar16 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar16 = local_2d8;
  }
  if (uVar16 < (ulong)(local_c8 + local_2e0)) {
    uVar16 = 0xf;
    if (local_d0 != local_c0) {
      uVar16 = local_c0[0];
    }
    if (uVar16 < (ulong)(local_c8 + local_2e0)) goto LAB_002227e4;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_002227e4:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_d0);
  }
  local_330 = &local_320;
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_320 = *puVar21;
    uStack_318 = puVar6[3];
  }
  else {
    local_320 = *puVar21;
    local_330 = (ulong *)*puVar6;
  }
  local_328 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)puVar21 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_330);
  local_350 = &local_340;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_340 = *puVar21;
    lStack_338 = plVar5[3];
  }
  else {
    local_340 = *puVar21;
    local_350 = (ulong *)*plVar5;
  }
  local_348 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,'\x06');
  uVar16 = 0xf;
  if (local_350 != &local_340) {
    uVar16 = local_340;
  }
  if (uVar16 < (ulong)(local_e8 + local_348)) {
    uVar16 = 0xf;
    if (local_f0 != local_e0) {
      uVar16 = local_e0[0];
    }
    if (uVar16 < (ulong)(local_e8 + local_348)) goto LAB_00222914;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_00222914:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_f0);
  }
  local_378 = &local_368;
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_368 = *puVar21;
    lStack_360 = puVar6[3];
  }
  else {
    local_368 = *puVar21;
    local_378 = (ulong *)*puVar6;
  }
  local_370 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)puVar21 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_378);
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish;
  plVar11 = plVar5 + 2;
  if ((_Bit_iterator *)*plVar5 == (_Bit_iterator *)plVar11) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar5[3];
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a8,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p !=
      &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  p_Var9 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140);
  }
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  local_350 = &local_340;
  std::__cxx11::string::_M_construct((ulong)&local_350,'\x06');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_350);
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_368 = *puVar21;
    lStack_360 = plVar5[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar21;
    local_378 = (ulong *)*plVar5;
  }
  local_370 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar11 = plVar5 + 2;
  if ((_Bit_iterator *)*plVar5 == (_Bit_iterator *)plVar11) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar5[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a8,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var9) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if ((char)local_148 == '\0') {
    for (uVar16 = 0;
        sVar7 = TreeDecomposition::numberOfRelations
                          ((local_358->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        , uVar16 < sVar7; uVar16 = uVar16 + 1) {
      pTVar8 = TreeDecomposition::getRelation
                         ((local_358->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar16);
      local_330 = &local_320;
      std::__cxx11::string::_M_construct((ulong)&local_330,'\x06');
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
      local_350 = &local_340;
      puVar21 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar21) {
        local_340 = *puVar21;
        lStack_338 = puVar6[3];
      }
      else {
        local_340 = *puVar21;
        local_350 = (ulong *)*puVar6;
      }
      local_348 = puVar6[1];
      *puVar6 = puVar21;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_350,(ulong)(pTVar8->_name)._M_dataplus._M_p);
      puVar21 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar21) {
        local_368 = *puVar21;
        lStack_360 = puVar6[3];
        local_378 = &local_368;
      }
      else {
        local_368 = *puVar21;
        local_378 = (ulong *)*puVar6;
      }
      local_370 = puVar6[1];
      *puVar6 = puVar21;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
      plVar5 = puVar6 + 2;
      if ((_Bit_iterator *)*puVar6 == (_Bit_iterator *)plVar5) {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = puVar6[3];
      }
      else {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar6;
      }
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_1a8,
                 (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      if ((_Bit_iterator *)
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish) {
        operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378);
      }
      if (local_350 != &local_340) {
        operator_delete(local_350);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330);
      }
    }
  }
  else {
    for (uVar16 = 0;
        sVar7 = TreeDecomposition::numberOfRelations
                          ((local_358->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        , uVar16 < sVar7; uVar16 = uVar16 + 1) {
      pTVar8 = TreeDecomposition::getRelation
                         ((local_358->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar16);
      local_2c8 = &local_2b8;
      std::__cxx11::string::_M_construct((ulong)&local_2c8,'\x06');
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
      local_2e8 = &local_2d8;
      puVar21 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar21) {
        local_2d8 = *puVar21;
        lStack_2d0 = puVar6[3];
      }
      else {
        local_2d8 = *puVar21;
        local_2e8 = (ulong *)*puVar6;
      }
      local_2e0 = puVar6[1];
      *puVar6 = puVar21;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_2e8,(ulong)(pTVar8->_name)._M_dataplus._M_p);
      puVar21 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar21) {
        local_320 = *puVar21;
        uStack_318 = puVar6[3];
        local_330 = &local_320;
      }
      else {
        local_320 = *puVar21;
        local_330 = (ulong *)*puVar6;
      }
      local_328 = puVar6[1];
      *puVar6 = puVar21;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
      local_350 = &local_340;
      puVar21 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar21) {
        local_340 = *puVar21;
        lStack_338 = puVar6[3];
      }
      else {
        local_340 = *puVar21;
        local_350 = (ulong *)*puVar6;
      }
      local_348 = puVar6[1];
      *puVar6 = puVar21;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_350,(ulong)(pTVar8->_name)._M_dataplus._M_p);
      puVar21 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar21) {
        local_368 = *puVar21;
        lStack_360 = puVar6[3];
        local_378 = &local_368;
      }
      else {
        local_368 = *puVar21;
        local_378 = (ulong *)*puVar6;
      }
      local_370 = puVar6[1];
      *puVar6 = puVar21;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
      plVar5 = puVar6 + 2;
      if ((_Bit_iterator *)*puVar6 == (_Bit_iterator *)plVar5) {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = puVar6[3];
      }
      else {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar6;
      }
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_1a8,
                 (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      if ((_Bit_iterator *)
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish) {
        operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378);
      }
      if (local_350 != &local_340) {
        operator_delete(local_350);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8);
      }
    }
    for (uVar16 = 0;
        sVar7 = TreeDecomposition::numberOfRelations
                          ((local_358->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        , uVar16 < sVar7; uVar16 = uVar16 + 1) {
      pTVar8 = TreeDecomposition::getRelation
                         ((local_358->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar16);
      local_330 = &local_320;
      std::__cxx11::string::_M_construct((ulong)&local_330,'\x06');
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
      local_350 = &local_340;
      puVar21 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar21) {
        local_340 = *puVar21;
        lStack_338 = puVar6[3];
      }
      else {
        local_340 = *puVar21;
        local_350 = (ulong *)*puVar6;
      }
      local_348 = puVar6[1];
      *puVar6 = puVar21;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_350,(ulong)(pTVar8->_name)._M_dataplus._M_p);
      puVar21 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar21) {
        local_368 = *puVar21;
        lStack_360 = puVar6[3];
        local_378 = &local_368;
      }
      else {
        local_368 = *puVar21;
        local_378 = (ulong *)*puVar6;
      }
      local_370 = puVar6[1];
      *puVar6 = puVar21;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
      plVar5 = puVar6 + 2;
      if ((_Bit_iterator *)*puVar6 == (_Bit_iterator *)plVar5) {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = puVar6[3];
      }
      else {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar6;
      }
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_1a8,
                 (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      if ((_Bit_iterator *)
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish) {
        operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378);
      }
      if (local_350 != &local_340) {
        operator_delete(local_350);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330);
      }
    }
  }
  local_1e8 = &local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x06');
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,0x2afdd1);
  p_Var9 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
  local_208 = &local_1f8;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_1f8 = *puVar21;
    lStack_1f0 = plVar5[3];
  }
  else {
    local_1f8 = *puVar21;
    local_208 = (ulong *)*plVar5;
  }
  local_200 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
  local_1c8 = &local_1b8;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_1b8 = *puVar21;
    lStack_1b0 = plVar5[3];
  }
  else {
    local_1b8 = *puVar21;
    local_1c8 = (ulong *)*plVar5;
  }
  local_1c0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_228 = &local_218;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_218 = *puVar21;
    lStack_210 = plVar5[3];
  }
  else {
    local_218 = *puVar21;
    local_228 = (ulong *)*plVar5;
  }
  local_220 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_188 = &local_178;
  std::__cxx11::string::_M_construct((ulong)&local_188,'\x06');
  uVar16 = 0xf;
  if (local_228 != &local_218) {
    uVar16 = local_218;
  }
  if (uVar16 < (ulong)(local_180 + local_220)) {
    uVar16 = 0xf;
    if (local_188 != &local_178) {
      uVar16 = local_178;
    }
    if (uVar16 < (ulong)(local_180 + local_220)) goto LAB_00223530;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_228);
  }
  else {
LAB_00223530:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_188);
  }
  local_248 = &local_238;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_238 = *plVar5;
    lStack_230 = puVar6[3];
  }
  else {
    local_238 = *plVar5;
    local_248 = (long *)*puVar6;
  }
  local_240 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_268 = &local_258;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_258 = *puVar21;
    lStack_250 = plVar5[3];
  }
  else {
    local_258 = *puVar21;
    local_268 = (ulong *)*plVar5;
  }
  local_260 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_2a8 = &local_298;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_298 = *puVar21;
    lStack_290 = plVar5[3];
  }
  else {
    local_298 = *puVar21;
    local_2a8 = (ulong *)*plVar5;
  }
  local_2a0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_168 = &local_158;
  std::__cxx11::string::_M_construct((ulong)&local_168,'\x06');
  uVar16 = 0xf;
  if (local_2a8 != &local_298) {
    uVar16 = local_298;
  }
  if (uVar16 < (ulong)(local_160 + local_2a0)) {
    uVar16 = 0xf;
    if (local_168 != &local_158) {
      uVar16 = local_158;
    }
    if (uVar16 < (ulong)(local_160 + local_2a0)) goto LAB_002236e9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,(ulong)local_2a8);
  }
  else {
LAB_002236e9:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_168);
  }
  local_288 = &local_278;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_278 = *puVar1;
    uStack_270 = puVar6[3];
  }
  else {
    local_278 = *puVar1;
    local_288 = (undefined8 *)*puVar6;
  }
  local_280 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_2c8 = &local_2b8;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_2b8 = *puVar21;
    lStack_2b0 = plVar5[3];
  }
  else {
    local_2b8 = *puVar21;
    local_2c8 = (ulong *)*plVar5;
  }
  local_2c0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_2d8 = *puVar21;
    lStack_2d0 = puVar6[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar21;
    local_2e8 = (ulong *)*puVar6;
  }
  local_2e0 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_140 = &local_130;
  std::__cxx11::string::_M_construct((ulong)&local_140,'\x06');
  uVar16 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar16 = local_2d8;
  }
  if (uVar16 < (ulong)(local_138 + local_2e0)) {
    uVar16 = 0xf;
    if (local_140 != &local_130) {
      uVar16 = local_130;
    }
    if (uVar16 < (ulong)(local_138 + local_2e0)) goto LAB_002238a4;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_002238a4:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_140);
  }
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_320 = *puVar21;
    uStack_318 = puVar6[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar21;
    local_330 = (ulong *)*puVar6;
  }
  local_328 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)puVar21 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_340 = *puVar21;
    lStack_338 = puVar6[3];
    local_350 = &local_340;
  }
  else {
    local_340 = *puVar21;
    local_350 = (ulong *)*puVar6;
  }
  local_348 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_120 = local_110;
  std::__cxx11::string::_M_construct((ulong)&local_120,'\x06');
  uVar16 = 0xf;
  if (local_350 != &local_340) {
    uVar16 = local_340;
  }
  if (uVar16 < (ulong)(local_118 + local_348)) {
    uVar16 = 0xf;
    if (local_120 != local_110) {
      uVar16 = local_110[0];
    }
    if (uVar16 < (ulong)(local_118 + local_348)) goto LAB_002239cd;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_002239cd:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_120);
  }
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_368 = *puVar21;
    lStack_360 = puVar6[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar21;
    local_378 = (ulong *)*puVar6;
  }
  local_370 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)puVar21 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar11 = plVar5 + 2;
  if ((_Bit_iterator *)*plVar5 == (_Bit_iterator *)plVar11) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar5[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a8,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var9) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  local_350 = &local_340;
  std::__cxx11::string::_M_construct((ulong)&local_350,'\x06');
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_368 = *puVar21;
    lStack_360 = puVar6[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar21;
    local_378 = (ulong *)*puVar6;
  }
  local_370 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar11 = plVar5 + 2;
  if ((_Bit_iterator *)*plVar5 == (_Bit_iterator *)plVar11) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar5[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a8,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var9) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  pCVar19 = local_358;
  if ((char)local_148 == '\0') {
    if ((local_358->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_358->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar16 = 0;
      do {
        local_330 = &local_320;
        std::__cxx11::string::_M_construct((ulong)&local_330,'\x06');
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
        local_350 = &local_340;
        puVar21 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar21) {
          local_340 = *puVar21;
          lStack_338 = puVar6[3];
        }
        else {
          local_340 = *puVar21;
          local_350 = (ulong *)*puVar6;
        }
        local_348 = puVar6[1];
        *puVar6 = puVar21;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        cVar18 = '\x01';
        if (9 < uVar16) {
          uVar13 = uVar16;
          cVar4 = '\x04';
          do {
            cVar18 = cVar4;
            if (uVar13 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_00224a1d;
            }
            if (uVar13 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_00224a1d;
            }
            if (uVar13 < 10000) goto LAB_00224a1d;
            bVar2 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar4 = cVar18 + '\x04';
          } while (bVar2);
          cVar18 = cVar18 + '\x01';
        }
LAB_00224a1d:
        local_2e8 = &local_2d8;
        std::__cxx11::string::_M_construct((ulong)&local_2e8,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2e8,(uint)local_2e0,uVar16);
        uVar13 = 0xf;
        if (local_350 != &local_340) {
          uVar13 = local_340;
        }
        if (uVar13 < (ulong)(local_2e0 + local_348)) {
          uVar13 = 0xf;
          if (local_2e8 != &local_2d8) {
            uVar13 = local_2d8;
          }
          if (uVar13 < (ulong)(local_2e0 + local_348)) goto LAB_00224aa6;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_350);
        }
        else {
LAB_00224aa6:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_2e8);
        }
        local_378 = &local_368;
        puVar21 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar21) {
          local_368 = *puVar21;
          lStack_360 = puVar6[3];
        }
        else {
          local_368 = *puVar21;
          local_378 = (ulong *)*puVar6;
        }
        local_370 = puVar6[1];
        *puVar6 = puVar21;
        puVar6[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish;
        plVar5 = puVar6 + 2;
        if ((_Bit_iterator *)*puVar6 == (_Bit_iterator *)plVar5) {
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._8_8_ = puVar6[3];
        }
        else {
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar6;
        }
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)&local_1a8,
                   (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        if ((_Bit_iterator *)
            local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p !=
            &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish) {
          operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8);
        }
        if (local_350 != &local_340) {
          operator_delete(local_350);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < (ulong)(((long)(local_358->viewGroups).
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_358->viewGroups).
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
  }
  else {
    local_378 = (ulong *)((ulong)local_378 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_310,
               ((long)(local_358->viewGroups).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_358->viewGroups).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
               (bool *)&local_378,(allocator_type *)&local_350);
    if ((pCVar19->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar19->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar16 = 0;
      do {
        puVar17 = local_358->groupIncomingViews[uVar16].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar20 = local_358->groupIncomingViews[uVar16].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        p_Var9 = (_Bit_iterator *)
                 local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        pCVar19 = local_358;
        puVar3 = puVar20;
        local_f8 = uVar16;
        if (puVar17 != puVar20) {
          do {
            local_148 = puVar3;
            uVar16 = pCVar19->viewToGroupMapping[*puVar17];
            uVar13 = uVar16 + 0x3f;
            if (-1 < (long)uVar16) {
              uVar13 = uVar16;
            }
            uVar23 = (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001);
            if ((*(ulong *)((long)p_Var9 + (((long)uVar13 >> 6) + (uVar23 - 1)) * 8) >>
                 (uVar16 & 0x3f) & 1) == 0) {
              local_2e8 = &local_2d8;
              std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x06');
              puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
              local_330 = &local_320;
              puVar21 = puVar6 + 2;
              if ((ulong *)*puVar6 == puVar21) {
                local_320 = *puVar21;
                uStack_318 = puVar6[3];
              }
              else {
                local_320 = *puVar21;
                local_330 = (ulong *)*puVar6;
              }
              local_328 = puVar6[1];
              *puVar6 = puVar21;
              puVar6[1] = 0;
              *(undefined1 *)(puVar6 + 2) = 0;
              cVar18 = '\x01';
              if (9 < uVar16) {
                uVar12 = uVar16;
                cVar4 = '\x04';
                do {
                  cVar18 = cVar4;
                  if (uVar12 < 100) {
                    cVar18 = cVar18 + -2;
                    goto LAB_00223ef3;
                  }
                  if (uVar12 < 1000) {
                    cVar18 = cVar18 + -1;
                    goto LAB_00223ef3;
                  }
                  if (uVar12 < 10000) goto LAB_00223ef3;
                  bVar2 = 99999 < uVar12;
                  uVar12 = uVar12 / 10000;
                  cVar4 = cVar18 + '\x04';
                } while (bVar2);
                cVar18 = cVar18 + '\x01';
              }
LAB_00223ef3:
              local_2c8 = &local_2b8;
              std::__cxx11::string::_M_construct((ulong)&local_2c8,cVar18);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_2c8,(uint)local_2c0,uVar16);
              uVar12 = 0xf;
              if (local_330 != &local_320) {
                uVar12 = local_320;
              }
              if (uVar12 < (ulong)(local_2c0 + local_328)) {
                uVar12 = 0xf;
                if (local_2c8 != &local_2b8) {
                  uVar12 = local_2b8;
                }
                if (uVar12 < (ulong)(local_2c0 + local_328)) goto LAB_00223f86;
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_2c8,0,(char *)0x0,(ulong)local_330);
              }
              else {
LAB_00223f86:
                puVar6 = (undefined8 *)
                         std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2c8);
              }
              puVar21 = puVar6 + 2;
              if ((ulong *)*puVar6 == puVar21) {
                local_340 = *puVar21;
                lStack_338 = puVar6[3];
                local_350 = &local_340;
              }
              else {
                local_340 = *puVar21;
                local_350 = (ulong *)*puVar6;
              }
              local_348 = puVar6[1];
              *puVar6 = puVar21;
              puVar6[1] = 0;
              *(undefined1 *)puVar21 = 0;
              puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
              local_378 = &local_368;
              puVar21 = puVar6 + 2;
              if ((ulong *)*puVar6 == puVar21) {
                local_368 = *puVar21;
                lStack_360 = puVar6[3];
              }
              else {
                local_368 = *puVar21;
                local_378 = (ulong *)*puVar6;
              }
              local_370 = puVar6[1];
              *puVar6 = puVar21;
              puVar6[1] = 0;
              *(undefined1 *)(puVar6 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_378);
              if (local_378 != &local_368) {
                operator_delete(local_378);
              }
              if (local_350 != &local_340) {
                operator_delete(local_350);
              }
              if (local_2c8 != &local_2b8) {
                operator_delete(local_2c8);
              }
              if (local_330 != &local_320) {
                operator_delete(local_330);
              }
              if (local_2e8 != &local_2d8) {
                operator_delete(local_2e8);
              }
              puVar21 = (ulong *)((long)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl
                                        .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p + (((long)uVar13 >> 6) + (uVar23 - 1)) * 8);
              *puVar21 = *puVar21 | 1L << ((byte)uVar16 & 0x3f);
              p_Var9 = (_Bit_iterator *)
                       local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              pCVar19 = local_358;
              puVar20 = local_148;
            }
            puVar17 = puVar17 + 1;
            puVar3 = local_148;
          } while (puVar17 != puVar20);
        }
        local_288 = &local_278;
        std::__cxx11::string::_M_construct((ulong)&local_288,'\x06');
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
        uVar16 = local_f8;
        puVar21 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar21) {
          local_2b8 = *puVar21;
          lStack_2b0 = puVar6[3];
          local_2c8 = &local_2b8;
        }
        else {
          local_2b8 = *puVar21;
          local_2c8 = (ulong *)*puVar6;
        }
        local_2c0 = puVar6[1];
        *puVar6 = puVar21;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        cVar18 = '\x01';
        if (9 < local_f8) {
          uVar13 = local_f8;
          cVar4 = '\x04';
          do {
            cVar18 = cVar4;
            if (uVar13 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_002241ff;
            }
            if (uVar13 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_002241ff;
            }
            if (uVar13 < 10000) goto LAB_002241ff;
            bVar2 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar4 = cVar18 + '\x04';
          } while (bVar2);
          cVar18 = cVar18 + '\x01';
        }
LAB_002241ff:
        local_2a8 = &local_298;
        std::__cxx11::string::_M_construct((ulong)&local_2a8,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2a8,(uint)local_2a0,uVar16);
        uVar13 = 0xf;
        if (local_2c8 != &local_2b8) {
          uVar13 = local_2b8;
        }
        if (uVar13 < (ulong)(local_2a0 + local_2c0)) {
          uVar13 = 0xf;
          if (local_2a8 != &local_298) {
            uVar13 = local_298;
          }
          if (uVar13 < (ulong)(local_2a0 + local_2c0)) goto LAB_00224291;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_2c8);
        }
        else {
LAB_00224291:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_2a8);
        }
        puVar21 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar21) {
          local_2d8 = *puVar21;
          lStack_2d0 = puVar6[3];
          local_2e8 = &local_2d8;
        }
        else {
          local_2d8 = *puVar21;
          local_2e8 = (ulong *)*puVar6;
        }
        local_2e0 = puVar6[1];
        *puVar6 = puVar21;
        puVar6[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
        puVar21 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar21) {
          local_320 = *puVar21;
          uStack_318 = puVar6[3];
          local_330 = &local_320;
        }
        else {
          local_320 = *puVar21;
          local_330 = (ulong *)*puVar6;
        }
        local_328 = puVar6[1];
        *puVar6 = puVar21;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        cVar18 = '\x01';
        if (9 < uVar16) {
          uVar13 = uVar16;
          cVar4 = '\x04';
          do {
            cVar18 = cVar4;
            if (uVar13 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_002243b1;
            }
            if (uVar13 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_002243b1;
            }
            if (uVar13 < 10000) goto LAB_002243b1;
            bVar2 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar4 = cVar18 + '\x04';
          } while (bVar2);
          cVar18 = cVar18 + '\x01';
        }
LAB_002243b1:
        local_268 = &local_258;
        std::__cxx11::string::_M_construct((ulong)&local_268,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_268,(uint)local_260,uVar16);
        uVar13 = 0xf;
        if (local_330 != &local_320) {
          uVar13 = local_320;
        }
        if (uVar13 < (ulong)(local_260 + local_328)) {
          uVar13 = 0xf;
          if (local_268 != &local_258) {
            uVar13 = local_258;
          }
          if (uVar13 < (ulong)(local_260 + local_328)) goto LAB_0022443a;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_330);
        }
        else {
LAB_0022443a:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_268);
        }
        puVar21 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar21) {
          local_340 = *puVar21;
          lStack_338 = puVar6[3];
          local_350 = &local_340;
        }
        else {
          local_340 = *puVar21;
          local_350 = (ulong *)*puVar6;
        }
        local_348 = puVar6[1];
        *puVar6 = puVar21;
        puVar6[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
        puVar21 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar21) {
          local_368 = *puVar21;
          lStack_360 = puVar6[3];
          local_378 = &local_368;
        }
        else {
          local_368 = *puVar21;
          local_378 = (ulong *)*puVar6;
        }
        local_370 = puVar6[1];
        *puVar6 = puVar21;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_378);
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_350 != &local_340) {
          operator_delete(local_350);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8);
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8);
        }
        if (local_288 != &local_278) {
          operator_delete(local_288);
        }
        uVar16 = uVar16 + 1;
        pvVar10 = (local_358->viewGroups).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar14 = (local_358->viewGroups).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (uVar16 < (ulong)(((long)pvVar14 - (long)pvVar10 >> 3) * -0x5555555555555555));
      if (pvVar14 != pvVar10) {
        uVar16 = 0;
        do {
          uVar13 = uVar16 + 0x3f;
          if (-1 < (long)uVar16) {
            uVar13 = uVar16;
          }
          if ((*(ulong *)((long)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (((long)uVar13 >> 6) +
                         ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) >>
               (uVar16 & 0x3f) & 1) == 0) {
            local_2e8 = &local_2d8;
            std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x06');
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
            puVar21 = puVar6 + 2;
            if ((ulong *)*puVar6 == puVar21) {
              local_320 = *puVar21;
              uStack_318 = puVar6[3];
              local_330 = &local_320;
            }
            else {
              local_320 = *puVar21;
              local_330 = (ulong *)*puVar6;
            }
            local_328 = puVar6[1];
            *puVar6 = puVar21;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            cVar18 = '\x01';
            if (9 < uVar16) {
              uVar13 = uVar16;
              cVar4 = '\x04';
              do {
                cVar18 = cVar4;
                if (uVar13 < 100) {
                  cVar18 = cVar18 + -2;
                  goto LAB_00224702;
                }
                if (uVar13 < 1000) {
                  cVar18 = cVar18 + -1;
                  goto LAB_00224702;
                }
                if (uVar13 < 10000) goto LAB_00224702;
                bVar2 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar4 = cVar18 + '\x04';
              } while (bVar2);
              cVar18 = cVar18 + '\x01';
            }
LAB_00224702:
            local_2c8 = &local_2b8;
            std::__cxx11::string::_M_construct((ulong)&local_2c8,cVar18);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_2c8,(uint)local_2c0,uVar16);
            uVar13 = 0xf;
            if (local_330 != &local_320) {
              uVar13 = local_320;
            }
            if (uVar13 < (ulong)(local_2c0 + local_328)) {
              uVar13 = 0xf;
              if (local_2c8 != &local_2b8) {
                uVar13 = local_2b8;
              }
              if (uVar13 < (ulong)(local_2c0 + local_328)) goto LAB_00224786;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_2c8,0,(char *)0x0,(ulong)local_330);
            }
            else {
LAB_00224786:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2c8);
            }
            local_350 = &local_340;
            puVar21 = puVar6 + 2;
            if ((ulong *)*puVar6 == puVar21) {
              local_340 = *puVar21;
              lStack_338 = puVar6[3];
            }
            else {
              local_340 = *puVar21;
              local_350 = (ulong *)*puVar6;
            }
            local_348 = puVar6[1];
            *puVar6 = puVar21;
            puVar6[1] = 0;
            *(undefined1 *)puVar21 = 0;
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
            puVar21 = puVar6 + 2;
            if ((ulong *)*puVar6 == puVar21) {
              local_368 = *puVar21;
              lStack_360 = puVar6[3];
              local_378 = &local_368;
            }
            else {
              local_368 = *puVar21;
              local_378 = (ulong *)*puVar6;
            }
            local_370 = puVar6[1];
            *puVar6 = puVar21;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_378);
            if (local_378 != &local_368) {
              operator_delete(local_378);
            }
            if (local_350 != &local_340) {
              operator_delete(local_350);
            }
            if (local_2c8 != &local_2b8) {
              operator_delete(local_2c8);
            }
            if (local_330 != &local_320) {
              operator_delete(local_330);
            }
            if (local_2e8 != &local_2d8) {
              operator_delete(local_2e8);
            }
            pvVar10 = (local_358->viewGroups).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar14 = (local_358->viewGroups).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (ulong)(((long)pvVar14 - (long)pvVar10 >> 3) * -0x5555555555555555));
      }
    }
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_iterator *)0x0) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ =
           local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    }
  }
  local_228 = &local_218;
  std::__cxx11::string::_M_construct((ulong)&local_228,'\x06');
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x2afdd1);
  local_248 = &local_238;
  plVar11 = plVar5 + 2;
  if ((long *)*plVar5 == plVar11) {
    local_238 = *plVar11;
    lStack_230 = plVar5[3];
  }
  else {
    local_238 = *plVar11;
    local_248 = (long *)*plVar5;
  }
  p_Var9 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
  local_240 = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_268 = &local_258;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_258 = *puVar21;
    lStack_250 = plVar5[3];
  }
  else {
    local_258 = *puVar21;
    local_268 = (ulong *)*plVar5;
  }
  local_260 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_2a8 = &local_298;
  puVar21 = (ulong *)(plVar5 + 2);
  local_1c8 = &local_1b8;
  if ((ulong *)*plVar5 == puVar21) {
    local_298 = *puVar21;
    lStack_290 = plVar5[3];
  }
  else {
    local_298 = *puVar21;
    local_2a8 = (ulong *)*plVar5;
  }
  local_2a0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,'\x06');
  uVar16 = 0xf;
  if (local_2a8 != &local_298) {
    uVar16 = local_298;
  }
  if (uVar16 < (ulong)(local_1c0 + local_2a0)) {
    uVar16 = 0xf;
    if (local_1c8 != &local_1b8) {
      uVar16 = local_1b8;
    }
    if (uVar16 < (ulong)(local_1c0 + local_2a0)) goto LAB_00224e0c;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_2a8);
  }
  else {
LAB_00224e0c:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_1c8);
  }
  local_288 = &local_278;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_278 = *puVar1;
    uStack_270 = puVar6[3];
  }
  else {
    local_278 = *puVar1;
    local_288 = (undefined8 *)*puVar6;
  }
  local_280 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_2c8 = &local_2b8;
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_2b8 = *puVar21;
    lStack_2b0 = plVar5[3];
  }
  else {
    local_2b8 = *puVar21;
    local_2c8 = (ulong *)*plVar5;
  }
  local_2c0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_2d8 = *puVar21;
    lStack_2d0 = plVar5[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar21;
    local_2e8 = (ulong *)*plVar5;
  }
  local_2e0 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct((ulong)&local_208,'\x06');
  uVar16 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar16 = local_2d8;
  }
  if (uVar16 < (ulong)(local_200 + local_2e0)) {
    uVar16 = 0xf;
    if (local_208 != &local_1f8) {
      uVar16 = local_1f8;
    }
    if (uVar16 < (ulong)(local_200 + local_2e0)) goto LAB_00224fc7;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_00224fc7:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_208);
  }
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_320 = *puVar21;
    uStack_318 = puVar6[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar21;
    local_330 = (ulong *)*puVar6;
  }
  local_328 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)puVar21 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_330);
  puVar21 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar21) {
    local_340 = *puVar21;
    lStack_338 = plVar5[3];
    local_350 = &local_340;
  }
  else {
    local_340 = *puVar21;
    local_350 = (ulong *)*plVar5;
  }
  local_348 = plVar5[1];
  *plVar5 = (long)puVar21;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1e8 = &local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x06');
  uVar16 = 0xf;
  if (local_350 != &local_340) {
    uVar16 = local_340;
  }
  if (uVar16 < (ulong)(local_1e0 + local_348)) {
    uVar16 = 0xf;
    if (local_1e8 != &local_1d8) {
      uVar16 = local_1d8;
    }
    if (uVar16 < (ulong)(local_1e0 + local_348)) goto LAB_002250e0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_002250e0:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_1e8);
  }
  puVar21 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar21) {
    local_368 = *puVar21;
    lStack_360 = puVar6[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar21;
    local_378 = (ulong *)*puVar6;
  }
  local_370 = puVar6[1];
  *puVar6 = puVar21;
  puVar6[1] = 0;
  *(undefined1 *)puVar21 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar11 = plVar5 + 2;
  if ((_Bit_iterator *)*plVar5 == (_Bit_iterator *)plVar11) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar5[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a8,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var9) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  local_378 = &local_368;
  std::__cxx11::string::_M_construct((ulong)&local_378,'\x06');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar11 = plVar5 + 2;
  if ((_Bit_iterator *)*plVar5 == (_Bit_iterator *)plVar11) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar5[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a8,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var9) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  lVar24 = 8;
  for (uVar16 = 0;
      sVar7 = QueryCompiler::numberOfViews
                        ((local_358->_qc).
                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
      uVar16 < sVar7; uVar16 = uVar16 + 1) {
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct((ulong)&local_2c8,'\x06');
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
    local_2e8 = &local_2d8;
    puVar21 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar21) {
      local_2d8 = *puVar21;
      lStack_2d0 = puVar6[3];
    }
    else {
      local_2d8 = *puVar21;
      local_2e8 = (ulong *)*puVar6;
    }
    local_2e0 = puVar6[1];
    *puVar6 = puVar21;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2e8,*(ulong *)((long)local_358->viewName + lVar24 + -8));
    local_330 = &local_320;
    puVar21 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar21) {
      local_320 = *puVar21;
      uStack_318 = puVar6[3];
    }
    else {
      local_320 = *puVar21;
      local_330 = (ulong *)*puVar6;
    }
    local_328 = puVar6[1];
    *puVar6 = puVar21;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
    local_350 = &local_340;
    puVar21 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar21) {
      local_340 = *puVar21;
      lStack_338 = puVar6[3];
    }
    else {
      local_340 = *puVar21;
      local_350 = (ulong *)*puVar6;
    }
    local_348 = puVar6[1];
    *puVar6 = puVar21;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_350,*(ulong *)((long)local_358->viewName + lVar24 + -8));
    local_378 = &local_368;
    puVar21 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar21) {
      local_368 = *puVar21;
      lStack_360 = puVar6[3];
    }
    else {
      local_368 = *puVar21;
      local_378 = (ulong *)*puVar6;
    }
    local_370 = puVar6[1];
    *puVar6 = puVar21;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish;
    plVar5 = puVar6 + 2;
    if ((_Bit_iterator *)*puVar6 == (_Bit_iterator *)plVar5) {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = puVar6[3];
    }
    else {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)*puVar6;
    }
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&local_1a8,
               (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p !=
        &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378);
    }
    if (local_350 != &local_340) {
      operator_delete(local_350);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8);
    }
    lVar24 = lVar24 + 0x20;
  }
  if (local_358->_hasApplicationHandler == false) {
    local_330 = &local_320;
    std::__cxx11::string::_M_construct((ulong)&local_330,'\x06');
    psVar22 = local_100;
    p_Var9 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
    puVar21 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar21) {
      local_340 = *puVar21;
      lStack_338 = puVar6[3];
      local_350 = &local_340;
    }
    else {
      local_340 = *puVar21;
      local_350 = (ulong *)*puVar6;
    }
    local_348 = puVar6[1];
    *puVar6 = puVar21;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_2e8 = &local_2d8;
    std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x06');
    uVar16 = 0xf;
    if (local_350 != &local_340) {
      uVar16 = local_340;
    }
    if (uVar16 < (ulong)(local_2e0 + local_348)) {
      uVar16 = 0xf;
      if (local_2e8 != &local_2d8) {
        uVar16 = local_2d8;
      }
      if (uVar16 < (ulong)(local_2e0 + local_348)) goto LAB_00225871;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_350);
    }
    else {
LAB_00225871:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_2e8);
    }
    puVar21 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar21) {
      local_368 = *puVar21;
      lStack_360 = puVar6[3];
      local_378 = &local_368;
    }
    else {
      local_368 = *puVar21;
      local_378 = (ulong *)*puVar6;
    }
    local_370 = puVar6[1];
    *puVar6 = puVar21;
    puVar6[1] = 0;
    *(undefined1 *)puVar21 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_378);
    plVar11 = plVar5 + 2;
    if ((_Bit_iterator *)*plVar5 == (_Bit_iterator *)plVar11) {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = plVar5[3];
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
    }
    else {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
    }
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = plVar5[1];
    *plVar5 = (long)plVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&local_1a8,
               (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var9) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8);
    }
    if (local_350 != &local_340) {
      operator_delete(local_350);
    }
    puVar21 = local_330;
    if (local_330 == &local_320) goto LAB_00225b6c;
  }
  else {
    local_2e8 = &local_2d8;
    std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x06');
    psVar22 = local_100;
    p_Var9 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
    puVar21 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar21) {
      local_320 = *puVar21;
      uStack_318 = puVar6[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *puVar21;
      local_330 = (ulong *)*puVar6;
    }
    local_328 = puVar6[1];
    *puVar6 = puVar21;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct((ulong)&local_2c8,'\x06');
    uVar16 = 0xf;
    if (local_330 != &local_320) {
      uVar16 = local_320;
    }
    if (uVar16 < (ulong)(local_2c0 + local_328)) {
      uVar16 = 0xf;
      if (local_2c8 != &local_2b8) {
        uVar16 = local_2b8;
      }
      if (uVar16 < (ulong)(local_2c0 + local_328)) goto LAB_002257cc;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_002257cc:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2c8);
    }
    puVar21 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar21) {
      local_340 = *puVar21;
      lStack_338 = puVar6[3];
      local_350 = &local_340;
    }
    else {
      local_340 = *puVar21;
      local_350 = (ulong *)*puVar6;
    }
    local_348 = puVar6[1];
    *puVar6 = puVar21;
    puVar6[1] = 0;
    *(undefined1 *)puVar21 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
    puVar21 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar21) {
      local_368 = *puVar21;
      lStack_360 = puVar6[3];
      local_378 = &local_368;
    }
    else {
      local_368 = *puVar21;
      local_378 = (ulong *)*puVar6;
    }
    local_370 = puVar6[1];
    *puVar6 = puVar21;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_378);
    plVar11 = plVar5 + 2;
    if ((_Bit_iterator *)*plVar5 == (_Bit_iterator *)plVar11) {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = plVar5[3];
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
    }
    else {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
    }
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = plVar5[1];
    *plVar5 = (long)plVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&local_1a8,
               (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var9) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378);
    }
    if (local_350 != &local_340) {
      operator_delete(local_350);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8);
    }
    if (multifaq::cppgen::BENCH_INDIVIDUAL == '\x01') {
      local_378 = &local_368;
      std::__cxx11::string::_M_construct((ulong)&local_378,'\x06');
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
      plVar5 = puVar6 + 2;
      if ((_Bit_iterator *)*puVar6 == (_Bit_iterator *)plVar5) {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = puVar6[3];
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
      }
      else {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar6;
      }
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_1a8,
                 (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      if ((_Bit_iterator *)
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != p_Var9) {
        operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378);
      }
    }
    local_378 = &local_368;
    std::__cxx11::string::_M_construct((ulong)&local_378,'\x06');
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
    plVar5 = puVar6 + 2;
    if ((_Bit_iterator *)*puVar6 == (_Bit_iterator *)plVar5) {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = puVar6[3];
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
    }
    else {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)*puVar6;
    }
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&local_1a8,
               (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var9) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    puVar21 = local_378;
    if (local_378 == &local_368) goto LAB_00225b6c;
  }
  operator_delete(puVar21);
LAB_00225b6c:
  p_Var9 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
  local_378 = &local_368;
  std::__cxx11::string::_M_construct((ulong)&local_378,'\x03');
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_1a8);
  plVar11 = plVar5 + 2;
  if ((_Bit_iterator *)*plVar5 == (_Bit_iterator *)plVar11) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar5[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var9;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar11;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar5;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
  (psVar22->_M_dataplus)._M_p = (pointer)&psVar22->field_2;
  psVar15 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar15) {
    lVar24 = plVar5[3];
    (psVar22->field_2)._M_allocated_capacity = *psVar15;
    *(long *)((long)&psVar22->field_2 + 8) = lVar24;
  }
  else {
    (psVar22->_M_dataplus)._M_p = (pointer)*plVar5;
    (psVar22->field_2)._M_allocated_capacity = *psVar15;
  }
  psVar22->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar15;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var9) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  return psVar22;
}

Assistant:

std::string CppGenerator::genRunFunction(bool parallelize)
{
    std::string returnString = offset(1)+"void run()\n"+
        offset(1)+"{\n";
    
    returnString += offset(2)+"int64_t startLoading = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n"+
        offset(2)+"loadRelations();\n\n"+
        offset(2)+"int64_t loadTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startLoading;\n"+
        offset(2)+"std::cout << \"Data loading: \"+"+
        "std::to_string(loadTime)+\"ms.\\n\";\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << loadTime;\n"+
        offset(2)+"ofs.close();\n\n";
    
    returnString += offset(2)+"int64_t startSorting = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n";

    if (!parallelize)
    {
        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"sort"+node->_name+"();\n";
        }
    }
    else
    {
        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"std::thread sort"+node->_name+
                "Thread(sort"+node->_name+");\n";
        }

        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"sort"+node->_name+"Thread.join();\n";
        }
    }
    
    returnString += "\n"+offset(2)+"int64_t sortingTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startSorting;\n"+
        offset(2)+"std::cout << \"Data sorting: \" + "+
        "std::to_string(sortingTime)+\"ms.\\n\";\n\n"+
        offset(2)+"ofs.open(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << sortingTime;\n"+
        offset(2)+"ofs.close();\n\n";

    returnString += offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n";

    if (!parallelize)
    {
        for (size_t group = 0; group < viewGroups.size(); ++group)
            returnString += offset(2)+"computeGroup"+std::to_string(group)+"();\n";
    }
    else
    {
        std::vector<bool> joinedGroups(viewGroups.size());
    
        for (size_t group = 0; group < viewGroups.size(); ++group)
        {
            for (const size_t& viewID : groupIncomingViews[group])
            {
                // find group that contains this view!
                size_t otherGroup = viewToGroupMapping[viewID];
                if (!joinedGroups[otherGroup])
                {
                    returnString += offset(2)+"group"+std::to_string(otherGroup)+
                        "Thread.join();\n";
                    joinedGroups[otherGroup] = 1;
                }
            }

            returnString += offset(2)+"std::thread group"+std::to_string(group)+
                    "Thread(computeGroup"+std::to_string(group)+");\n";            
        }

        for (size_t group = 0; group < viewGroups.size(); ++group)
        {
            if (!joinedGroups[group])
                returnString += offset(2)+"group"+std::to_string(group)+
                    "Thread.join();\n";
        }
    }
    
    returnString += "\n"+offset(2)+"int64_t processTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
        offset(2)+"std::cout << \"Data process: \"+"+
        "std::to_string(processTime)+\"ms.\\n\";\n"+
        offset(2)+"ofs.open(\"times.txt\",std::ofstream::out | std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << processTime;\n";
    
    // if (BENCH_INDIVIDUAL)    
    returnString += offset(2)+"std::cout << \"Size of each computed View: \" << std::endl;\n";
    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
    {
        returnString += offset(2)+"std::cout << \""+viewName[view]+": \" << "+
            viewName[view]+".size() << std::endl;\n";
    }
    
    if (_hasApplicationHandler)
    {
        returnString += offset(2)+"ofs.close();\n\n"+
            offset(2)+"int64_t appProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count();\n\n";

        if (BENCH_INDIVIDUAL)
            returnString += offset(2)+"std::cout << \"run Application:\\n\";\n";

        returnString += offset(2)+"runApplication();\n"; 
    }
    else {        
        returnString += offset(2)+"ofs << std::endl;\n"+
            offset(2)+"ofs.close();\n\n";
    }
    
    return returnString+offset(1)+"}\n";
}